

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O2

void init_noise(void)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  long lVar4;
  double dVar5;
  Vector rp;
  Vector local_28;
  
  srand(0);
  piVar3 = (int *)operator_new__(0x4000);
  hash_table = piVar3;
  for (lVar4 = 0; lVar4 != 0x1000; lVar4 = lVar4 + 1) {
    piVar3[lVar4] = (int)lVar4;
  }
  for (lVar4 = 0x3ffc; lVar4 != 0; lVar4 = lVar4 + -4) {
    dVar5 = rnd();
    piVar3 = hash_table;
    iVar1 = *(int *)((long)hash_table + lVar4);
    *(int *)((long)hash_table + lVar4) = hash_table[(int)(dVar5 * 4096.0)];
    piVar3[(int)(dVar5 * 4096.0)] = iVar1;
  }
  noise_table = (double *)operator_new__(0x858);
  for (lVar4 = 0; lVar4 != 0x10b; lVar4 = lVar4 + 1) {
    local_28.x = (double)(int)lVar4;
    local_28.y = local_28.x;
    local_28.z = local_28.x;
    uVar2 = R(&local_28);
    noise_table[lVar4] = (double)(int)uVar2 * 3.0518043793392844e-05 + -1.0;
  }
  return;
}

Assistant:

void init_noise()
{
   int   i, j, k;
   Vector rp;

   srand(0);
   //
   // Init hash table
   //
   hash_table = new int [4096];
   for( i = 0; i <   4096; i++ )
      hash_table[i] =   i;

   for( i = 4095; i > 0; i-- )
   {
      j =   (int)(rnd() * 4096.0);
      k =   hash_table[i];
      hash_table[i] =   hash_table[j];
      hash_table[j] =   k;
   }
   //
   // Init noise table
   //
   noise_table = new double [max_noise_size];

   for( i = 0; i <   max_noise_size;   i++   )
   {
      rp = (double)i;
      noise_table[i] = R(rp) * REALSCALE - 1.0;

#if   !defined(FINAL)
//    printf("NoiseTable[%d] == %g\n",i,NoiseTable[i]);
#endif

   }
}